

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t c4::yml::preprocess_rxmap(csubstr s,substr buf)

{
  byte open_close;
  code *pcVar1;
  csubstr s_00;
  csubstr s_01;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  csubstr s_02;
  csubstr s_03;
  basic_substring<const_char> bVar9;
  _SubstrWriter local_78;
  basic_substring<const_char> local_60;
  undefined8 local_50;
  csubstr cStack_48;
  char *local_38;
  
  local_78.buf.len = buf.len;
  local_78.buf.str = buf.str;
  pcVar5 = (char *)s.len;
  pcVar6 = s.str;
  local_78.pos = 0;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else if (*pcVar6 == '{') {
    if ((pcVar6 + -1)[(long)pcVar5] != '}') {
      if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        pcVar1 = (code *)swi(3);
        sVar3 = (*pcVar1)();
        return sVar3;
      }
      cStack_48 = to_csubstr(
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                            );
      local_60.str._0_4_ = 0;
      local_60.str._4_4_ = 0;
      local_60.len._0_4_ = 0x8160;
      local_60.len._4_4_ = 0;
      local_50 = 0;
      (*(code *)PTR_error_impl_00231548)
                ("check failed: s.ends_with(\'}\')",0x1e,(anonymous_namespace)::s_default_callbacks)
      ;
    }
    basic_substring<const_char>::basic_substring(&local_60,pcVar6 + 1,(size_t)(pcVar5 + -2));
    pcVar6 = (char *)CONCAT44(local_60.str._4_4_,local_60.str._0_4_);
    pcVar5 = (char *)CONCAT44(local_60.len._4_4_,(undefined4)local_60.len);
  }
  if (local_78.pos < local_78.buf.len) {
    local_78.buf.str[local_78.pos] = '{';
  }
  local_78.pos = local_78.pos + 1;
  pcVar7 = (char *)0x0;
  local_38 = (char *)0x0;
  iVar8 = 0;
  do {
    if (pcVar5 < pcVar7 || (long)pcVar5 - (long)pcVar7 == 0) {
      if (local_38 <= pcVar5) {
        basic_substring<const_char>::basic_substring
                  (&local_60,pcVar6 + (long)local_38,(long)pcVar5 - (long)local_38);
        s_01.str._4_4_ = local_60.str._4_4_;
        s_01.str._0_4_ = local_60.str._0_4_;
        s_01.len._0_4_ = (undefined4)local_60.len;
        s_01.len._4_4_ = local_60.len._4_4_;
        detail::_SubstrWriter::append(&local_78,s_01);
        if (iVar8 == 1) {
          s_03.len = 3;
          s_03.str = ": 1";
          detail::_SubstrWriter::append(&local_78,s_03);
        }
        if (local_78.pos < local_78.buf.len) {
          local_78.buf.str[local_78.pos] = '}';
        }
        return local_78.pos + 1;
      }
      if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        pcVar1 = (code *)swi(3);
        sVar3 = (*pcVar1)();
        return sVar3;
      }
      handle_error(0x1e7ac6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    if (pcVar7 + 1 < pcVar5) {
      bVar2 = pcVar6[(long)(pcVar7 + 1)] == ' ';
    }
    else {
      bVar2 = false;
    }
    open_close = pcVar6[(long)pcVar7];
    if ((open_close == 0x27) || (open_close == 0x22)) {
      basic_substring<const_char>::basic_substring
                (&local_60,pcVar6 + (long)pcVar7,(long)pcVar5 - (long)pcVar7);
      bVar9 = basic_substring<const_char>::pair_range_esc(&local_60,open_close,'\\');
      pcVar7 = pcVar7 + (long)(bVar9.str + (bVar9.len - (long)(pcVar6 + (long)pcVar7)));
      if (iVar8 < 2) {
        iVar8 = iVar8 + 1;
        goto LAB_001d6020;
      }
LAB_001d6097:
      iVar8 = 0;
    }
    else if (iVar8 == 0) {
      if (((((byte)(open_close - 0x30) < 10) || ((byte)((open_close & 0xdf) + 0xbf) < 0x1a)) ||
          ((open_close - 0x24 < 0x3c &&
           ((0x800000000000201U >> ((ulong)(open_close - 0x24) & 0x3f) & 1) != 0)))) ||
         (open_close == 0x7e)) {
LAB_001d60dd:
        if ((bool)(open_close == 0x3a & bVar2)) {
          iVar8 = 2;
        }
        else if ((bool)(open_close == 0x2c & bVar2)) {
          if (pcVar5 < local_38) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              pcVar1 = (code *)swi(3);
              sVar3 = (*pcVar1)();
              return sVar3;
            }
            handle_error(0x1e7ac6,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1544,"first >= 0 && first <= len");
          }
          pcVar4 = pcVar7;
          if (pcVar7 == (char *)0xffffffffffffffff) {
            pcVar4 = pcVar5;
          }
          if (pcVar4 < local_38) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              pcVar1 = (code *)swi(3);
              sVar3 = (*pcVar1)();
              return sVar3;
            }
            handle_error(0x1e7ac6,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1546,"first <= last");
          }
          if (pcVar5 < pcVar4) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              pcVar1 = (code *)swi(3);
              sVar3 = (*pcVar1)();
              return sVar3;
            }
            handle_error(0x1e7ac6,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1547,"last >= 0 && last <= len");
          }
          basic_substring<const_char>::basic_substring
                    (&local_60,local_38 + (long)pcVar6,(long)pcVar4 - (long)local_38);
          s_00.str._4_4_ = local_60.str._4_4_;
          s_00.str._0_4_ = local_60.str._0_4_;
          s_00.len._0_4_ = (undefined4)local_60.len;
          s_00.len._4_4_ = local_60.len._4_4_;
          detail::_SubstrWriter::append(&local_78,s_00);
          s_02.len = 5;
          s_02.str = ": 1, ";
          detail::_SubstrWriter::append(&local_78,s_02);
          local_38 = pcVar7 + 2;
          iVar8 = 1;
        }
        else {
          iVar8 = 1;
        }
      }
      else {
        iVar8 = 0;
      }
    }
    else {
LAB_001d6020:
      if (iVar8 == 2) {
        if (((open_close == 0x28) || (open_close == 0x7b)) || (open_close == 0x5b)) {
          if (pcVar5 < pcVar7) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              pcVar1 = (code *)swi(3);
              sVar3 = (*pcVar1)();
              return sVar3;
            }
            handle_error(0x1e7ac6,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1533,"first >= 0 && first <= len");
          }
          basic_substring<const_char>::basic_substring
                    (&local_60,pcVar6 + (long)pcVar7,(long)pcVar5 - (long)pcVar7);
          bVar9 = basic_substring<const_char>::pair_range_nested(&local_60,open_close,'\\');
          pcVar7 = bVar9.str + (long)(pcVar7 + (bVar9.len - (long)(pcVar6 + (long)pcVar7)));
          goto LAB_001d6097;
        }
        iVar8 = (uint)(byte)(~bVar2 | open_close != 0x2c) * 2;
      }
      else if (iVar8 == 1) goto LAB_001d60dd;
    }
    pcVar7 = pcVar7 + 1;
  } while( true );
}

Assistant:

size_t preprocess_rxmap(csubstr s, substr buf)
{
    detail::_SubstrWriter writer(buf);
    _ppstate state = kReadPending;
    size_t last = 0;

    if(s.begins_with('{'))
    {
        RYML_CHECK(s.ends_with('}'));
        s = s.offs(1, 1);
    }

    writer.append('{');

    for(size_t i = 0; i < s.len; ++i)
    {
        const char curr = s[i];
        const char next = i+1 < s.len ? s[i+1] : '\0';

        if(curr == '\'' || curr == '"')
        {
            csubstr ss = s.sub(i).pair_range_esc(curr, '\\');
            i += static_cast<size_t>(ss.end() - (s.str + i));
            state = _next(state);
        }
        else if(state == kReadPending && _is_idchar(curr))
        {
            state = _next(state);
        }

        switch(state)
        {
        case kKeyPending:
        {
            if(curr == ':' && next == ' ')
            {
                state = _next(state);
            }
            else if(curr == ',' && next == ' ')
            {
                writer.append(s.range(last, i));
                writer.append(": 1, ");
                last = i + 2;
            }
            break;
        }
        case kValPending:
        {
            if(curr == '[' || curr == '{' || curr == '(')
            {
                csubstr ss = s.sub(i).pair_range_nested(curr, '\\');
                i += static_cast<size_t>(ss.end() - (s.str + i));
                state = _next(state);
            }
            else if(curr == ',' && next == ' ')
            {
                state = _next(state);
            }
            break;
        }
        default:
            // nothing to do
            break;
        }
    }

    writer.append(s.sub(last));
    if(state == kKeyPending)
        writer.append(": 1");
    writer.append('}');

    return writer.pos;
}